

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::Continent::Continent(Continent *this,string *cname,int troops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *psVar4;
  int *piVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  
  psVar4 = (string *)operator_new(0x20);
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  pcVar2 = (cname->_M_dataplus)._M_p;
  paVar1 = &cname->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&cname->field_2 + 8);
    (psVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&psVar4->field_2 + 8) = uVar3;
  }
  else {
    (psVar4->_M_dataplus)._M_p = pcVar2;
    (psVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  psVar4->_M_string_length = cname->_M_string_length;
  (cname->_M_dataplus)._M_p = (pointer)paVar1;
  cname->_M_string_length = 0;
  (cname->field_2)._M_local_buf[0] = '\0';
  this->pCName = psVar4;
  piVar5 = (int *)operator_new(4);
  *piVar5 = troops;
  this->pCTroops = piVar5;
  pvVar6 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar6->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar6->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pCountriesInContinent = pvVar6;
  return;
}

Assistant:

Map::Continent::Continent(std::string cname, int troops) {
    pCName = new std::string(std::move(cname));
    pCTroops = new int(troops);
    pCountriesInContinent = new std::vector<Country*>;
}